

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnenum * rnn_findenum(rnndb *db,char *name)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x28) <= local_1c) {
      return (rnnenum *)0x0;
    }
    iVar1 = strcmp((char *)**(undefined8 **)(*(long *)(in_RDI + 0x20) + (long)local_1c * 8),in_RSI);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return *(rnnenum **)(*(long *)(in_RDI + 0x20) + (long)local_1c * 8);
}

Assistant:

struct rnnenum *rnn_findenum (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->enumsnum; i++)
		if (!strcmp(db->enums[i]->name, name))
			return db->enums[i];
	return 0;
}